

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O3

int run_ipc_test(char *helper,uv_read_cb read_cb)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  undefined8 *extraout_RDX;
  ulong uVar3;
  uv_process_t process;
  uv_process_t uStack_98;
  
  spawn_helper(&channel,&uStack_98,helper);
  uv_read_start(&channel,on_alloc,read_cb);
  uVar2 = uv_default_loop();
  uVar3 = 0;
  iVar1 = uv_run(uVar2);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uVar3 = 0;
    uv_run(uVar2);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_ipc_test_cold_1();
  }
  run_ipc_test_cold_2();
  if (uVar3 != 0) {
    if (-1 < (long)uVar3) {
      on_read_cold_1();
      return extraout_EAX_00;
    }
    if (uVar3 != 0xfffffffffffff001) {
      uVar2 = uv_strerror(uVar3 & 0xffffffff);
      printf("error recving on channel: %s\n",uVar2);
      abort();
    }
  }
  free((void *)*extraout_RDX);
  return extraout_EAX;
}

Assistant:

static int run_ipc_test(const char* helper, uv_read_cb read_cb) {
  uv_process_t process;
  int r;

  spawn_helper(&channel, &process, helper);
  uv_read_start((uv_stream_t*)&channel, on_alloc, read_cb);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}